

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_pick_cert(mbedtls_ssl_context *ssl,mbedtls_ssl_ciphersuite_t *ciphersuite_info)

{
  int iVar1;
  uint32_t local_40;
  mbedtls_pk_type_t local_3c;
  uint32_t flags;
  mbedtls_pk_type_t pk_alg;
  mbedtls_ssl_key_cert *fallback;
  mbedtls_ssl_key_cert *list;
  mbedtls_ssl_key_cert *cur;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info_local;
  mbedtls_ssl_context *ssl_local;
  
  _flags = (mbedtls_ssl_key_cert *)0x0;
  cur = (mbedtls_ssl_key_cert *)ciphersuite_info;
  ciphersuite_info_local = (mbedtls_ssl_ciphersuite_t *)ssl;
  local_3c = mbedtls_ssl_get_ciphersuite_sig_pk_alg(ciphersuite_info);
  if (*(long *)(*(long *)(ciphersuite_info_local + 2) + 0x398) == 0) {
    fallback = *(mbedtls_ssl_key_cert **)(*(long *)ciphersuite_info_local + 0xc0);
  }
  else {
    fallback = *(mbedtls_ssl_key_cert **)(*(long *)(ciphersuite_info_local + 2) + 0x398);
  }
  if (local_3c == MBEDTLS_PK_NONE) {
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)ciphersuite_info_local,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x24d,"ciphersuite requires certificate");
    if (fallback == (mbedtls_ssl_key_cert *)0x0) {
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x251,"server has no certificate");
      ssl_local._4_4_ = -1;
    }
    else {
      for (list = fallback; list != (mbedtls_ssl_key_cert *)0x0; list = list->next) {
        mbedtls_debug_print_crt
                  ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,600,"candidate certificate chain, certificate",list->cert);
        iVar1 = mbedtls_pk_can_do(list->key,local_3c);
        if (iVar1 == 0) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0x25c,"certificate mismatch: key type");
        }
        else {
          iVar1 = mbedtls_ssl_check_cert_usage
                            (list->cert,(mbedtls_ssl_ciphersuite_t *)cur,1,&local_40);
          if (iVar1 == 0) {
            if ((local_3c == MBEDTLS_PK_ECDSA) &&
               (iVar1 = ssl_check_key_curve(list->key,
                                            *(mbedtls_ecp_curve_info ***)
                                             (*(long *)(ciphersuite_info_local + 2) + 0x370)),
               iVar1 != 0)) {
              mbedtls_debug_print_msg
                        ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0x274,"certificate mismatch: elliptic curve");
            }
            else {
              if ((2 < (int)ciphersuite_info_local->key_exchange) ||
                 (list->cert->sig_md == MBEDTLS_MD_SHA1)) break;
              if (_flags == (mbedtls_ssl_key_cert *)0x0) {
                _flags = list;
              }
              mbedtls_debug_print_msg
                        ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0x285,"certificate not preferred: sha-2 with pre-TLS 1.2 client");
            }
          }
          else {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0x26c,"certificate mismatch: (extended) key usage extension");
          }
        }
      }
      if (list == (mbedtls_ssl_key_cert *)0x0) {
        list = _flags;
      }
      if (list == (mbedtls_ssl_key_cert *)0x0) {
        ssl_local._4_4_ = -1;
      }
      else {
        *(mbedtls_ssl_key_cert **)(*(long *)(ciphersuite_info_local + 2) + 0x388) = list;
        mbedtls_debug_print_crt
                  ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x296,"selected certificate chain, certificate",
                   (mbedtls_x509_crt *)
                   **(undefined8 **)(*(long *)(ciphersuite_info_local + 2) + 0x388));
        ssl_local._4_4_ = 0;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_pick_cert( mbedtls_ssl_context *ssl,
                          const mbedtls_ssl_ciphersuite_t * ciphersuite_info )
{
    mbedtls_ssl_key_cert *cur, *list, *fallback = NULL;
    mbedtls_pk_type_t pk_alg = mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info );
    uint32_t flags;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_key_cert != NULL )
        list = ssl->handshake->sni_key_cert;
    else
#endif
        list = ssl->conf->key_cert;

    if( pk_alg == MBEDTLS_PK_NONE )
        return( 0 );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite requires certificate" ) );

    if( list == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "server has no certificate" ) );
        return( -1 );
    }

    for( cur = list; cur != NULL; cur = cur->next )
    {
        MBEDTLS_SSL_DEBUG_CRT( 3, "candidate certificate chain, certificate",
                          cur->cert );

        if( ! mbedtls_pk_can_do( cur->key, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "certificate mismatch: key type" ) );
            continue;
        }

        /*
         * This avoids sending the client a cert it'll reject based on
         * keyUsage or other extensions.
         *
         * It also allows the user to provision different certificates for
         * different uses based on keyUsage, eg if they want to avoid signing
         * and decrypting with the same RSA key.
         */
        if( mbedtls_ssl_check_cert_usage( cur->cert, ciphersuite_info,
                                  MBEDTLS_SSL_IS_SERVER, &flags ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "certificate mismatch: "
                                "(extended) key usage extension" ) );
            continue;
        }

#if defined(MBEDTLS_ECDSA_C)
        if( pk_alg == MBEDTLS_PK_ECDSA &&
            ssl_check_key_curve( cur->key, ssl->handshake->curves ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "certificate mismatch: elliptic curve" ) );
            continue;
        }
#endif

        /*
         * Try to select a SHA-1 certificate for pre-1.2 clients, but still
         * present them a SHA-higher cert rather than failing if it's the only
         * one we got that satisfies the other conditions.
         */
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 &&
            cur->cert->sig_md != MBEDTLS_MD_SHA1 )
        {
            if( fallback == NULL )
                fallback = cur;
            {
                MBEDTLS_SSL_DEBUG_MSG( 3, ( "certificate not preferred: "
                                    "sha-2 with pre-TLS 1.2 client" ) );
            continue;
            }
        }

        /* If we get there, we got a winner */
        break;
    }

    if( cur == NULL )
        cur = fallback;

    /* Do not update ssl->handshake->key_cert unless there is a match */
    if( cur != NULL )
    {
        ssl->handshake->key_cert = cur;
        MBEDTLS_SSL_DEBUG_CRT( 3, "selected certificate chain, certificate",
                          ssl->handshake->key_cert->cert );
        return( 0 );
    }

    return( -1 );
}